

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
kratos::Generator::get_unique_variable_name
          (string *__return_storage_ptr__,Generator *this,string *prefix,string *var_name)

{
  bool bVar1;
  ulong uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  _Prime_rehash_policy _Var4;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_2a8 [16];
  string local_298;
  _Rb_tree_node_base local_278;
  undefined1 local_250 [16];
  string local_240;
  undefined1 local_20d;
  undefined1 local_20c [8];
  uint32_t count;
  string *var_name_local;
  string *prefix_local;
  Generator *this_local;
  string *result_name;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  undefined8 local_1a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  _Base_ptr local_190;
  _Base_ptr local_188;
  undefined1 local_180 [16];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_170;
  basic_string_view<char> local_168;
  _Rb_tree_node_base local_158;
  _Rb_tree_node_base *local_130;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_1;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *local_120;
  __buckets_ptr local_118;
  _Rb_tree_node_base *local_110;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_108;
  _Prime_rehash_policy local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_e8;
  __node_base local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_2;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *local_a0;
  string *local_98;
  __node_base_ptr local_90;
  __node_base local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  pointer local_60;
  _Rb_tree_node_base *local_58;
  pointer local_50;
  _Rb_tree_node_base *local_48;
  pointer local_40;
  __node_base local_38;
  __node_base local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  local_20c._0_4_ = 0;
  local_20d = '\0';
  unique0x1000054f = var_name;
  var_name_local = prefix;
  prefix_local = (string *)this;
  this_local = (Generator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_180._0_8_ = local_250 + 0x10;
    local_188 = (_Base_ptr)0xb320c3;
    local_190 = (_Base_ptr)var_name_local;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)stack0xfffffffffffffdf8;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[8],char>
              (&local_1c8,(v7 *)"{0}_{1}",(char (*) [8])var_name_local,stack0xfffffffffffffdf8,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)in_R8.values_);
    local_1a0 = &local_1c8;
    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                 )fmt::v7::to_string_view<char,_0>((char *)local_188);
    local_78 = (_Base_ptr)&result_name;
    local_80 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1a0;
    local_70 = (_Base_ptr)local_1a0;
    local_60 = (pointer)local_1a0;
    local_68 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_78,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_1a0);
    format_str.size_ = (size_t)result_name;
    format_str.data_ = (char *)local_1d8._8_8_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1e0.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)(local_250 + 0x10),(detail *)local_1d8._M_allocated_capacity,format_str,
               args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_250 + 0x10));
    std::__cxx11::string::~string((string *)(local_250 + 0x10));
    in_R8 = local_1e0;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)stack0xfffffffffffffdf8);
  }
  get_var((Generator *)local_250,(string *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_250);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_250);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    while( true ) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_88._M_nxt = (_Hash_node_base *)(local_2a8 + 0x10);
        local_90 = (__node_base_ptr)0xb320cb;
        local_98 = var_name_local;
        local_a0 = stack0xfffffffffffffdf8;
        vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                   *)local_20c;
        fmt::v7::
        make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,char[12],char>
                  (&local_e8,(v7 *)"{0}_{1}_{2}",(char (*) [12])var_name_local,
                   stack0xfffffffffffffdf8,
                   (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_2,
                   (remove_reference_t<unsigned_int_&> *)in_R9.values_);
        local_b0._M_nxt = (_Hash_node_base *)&local_e8;
        _Var4 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_90);
        local_28 = &local_108;
        local_30._M_nxt = local_b0._M_nxt;
        local_20 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_b0._M_nxt;
        local_10 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_b0._M_nxt;
        local_18 = local_28;
        local_f8 = _Var4;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0x2dd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_b0._M_nxt);
        format_str_01.size_ = local_108.desc_;
        format_str_01.data_ = (char *)local_f8._M_next_resize;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_108.field_1.values_;
        in_R8 = local_108.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)(local_2a8 + 0x10),(detail *)local_f8._0_8_,format_str_01,args_01);
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,(string *)(local_2a8 + 0x10));
        std::__cxx11::string::~string((string *)(local_2a8 + 0x10));
      }
      else {
        local_110 = &local_278;
        local_118 = (__buckets_ptr)0xb320c3;
        local_120 = stack0xfffffffffffffdf8;
        vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                   *)local_20c;
        fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_int&,char[8],char>
                  ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)&local_158,(v7 *)"{0}_{1}",(char (*) [8])stack0xfffffffffffffdf8,
                   (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_1,
                   (remove_reference_t<unsigned_int_&> *)in_R8.values_);
        local_130 = &local_158;
        bVar3 = fmt::v7::to_string_view<char,_0>((char *)local_118);
        local_50 = (pointer)(local_180 + 8);
        local_58 = local_130;
        local_48 = local_130;
        local_38._M_nxt = (_Hash_node_base *)local_130;
        local_40 = local_50;
        local_168 = bVar3;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_50,0x2d,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_130);
        format_str_00.size_ = local_180._8_8_;
        format_str_00.data_ = (char *)local_168.size_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_170.values_;
        in_R8 = local_170;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&local_278,(detail *)local_168.data_,format_str_00,args_00);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
      }
      get_var((Generator *)local_2a8,(string *)this);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2a8);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_2a8);
      if (((bVar1 ^ 0xffU) & 1) != 0) break;
      local_20c._0_4_ = local_20c._0_4_ + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::get_unique_variable_name(const std::string &prefix,
                                                const std::string &var_name) {
    // NOTE: this is not thread-safe!
    uint32_t count = 0;
    std::string result_name;
    // maybe we're lucky and not need to prefix the count
    if (prefix.empty()) {
        result_name = var_name;
    } else {
        result_name = ::format("{0}_{1}", prefix, var_name);
    }
    if (!get_var(result_name)) return result_name;

    while (true) {
        if (prefix.empty()) {
            result_name = ::format("{0}_{1}", var_name, count);
        } else {
            result_name = ::format("{0}_{1}_{2}", prefix, var_name, count);
        }
        if (!get_var(result_name)) {
            break;
        } else {
            count++;
        }
    }
    return result_name;
}